

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectAppearance.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::LinearObjectAppearance::Decode(LinearObjectAppearance *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (5 < KVar1) {
    KDataStream::Read<unsigned_short>
              (stream,&(this->super_ObjectAppearance).m_GeneralAppearanceUnion.
                       m_ui16GeneralAppearance);
    KDataStream::Read<unsigned_int>(stream,(uint *)&(this->super_ObjectAppearance).field_0xc);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void LinearObjectAppearance::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < LINEAR_OBJECT_APPEARANCE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    // Note: The order of the bytes is switched in the linear appearance to fix an alignment issue in the 1998 standard.
    stream >> m_GeneralAppearanceUnion.m_ui16GeneralAppearance
           >> m_SpecificAppearanceUnion.m_ui32SpecificAppearance;
}